

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O3

void __thiscall
QOpenGL2PaintEngineExPrivate::stroke(QOpenGL2PaintEngineExPrivate *this,QVectorPath *path,QPen *pen)

{
  long lVar1;
  QOpenGLEngineShaderManager *this_00;
  float *data;
  bool bVar2;
  qsizetype qVar3;
  char cVar4;
  int iVar5;
  socklen_t __len;
  QRectF *pQVar6;
  sockaddr *__addr;
  long lVar7;
  long in_FS_OFFSET;
  ulong uVar8;
  qreal *pqVar9;
  double dVar10;
  ElementType *pEVar11;
  double local_f8;
  QRectF local_b8;
  QBrush local_90 [8];
  QVectorPath local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->q->field_0x8;
  lVar7 = lVar1 + -8;
  if (lVar1 == 0) {
    lVar7 = 0;
  }
  if (this->snapToPixelGrid == true) {
    this->snapToPixelGrid = false;
    this->matrixDirty = true;
  }
  iVar5 = *(int *)(*(long *)pen + 0x18);
  QBrush::QBrush(local_90,(QBrush *)(*(long *)pen + 0x10));
  cVar4 = QBrush::isOpaque();
  if (cVar4 == '\0') {
    bVar2 = false;
  }
  else {
    bVar2 = 0.99 < *(double *)(lVar7 + 0x198);
  }
  if (this->mode != BrushDrawingMode) {
    this_00 = this->shaderManager;
    this_00->shaderProgNeedsChanging = true;
    this_00->complexGeometry = false;
    QOpenGLEngineShaderManager::setMaskType((QOpenGLEngineShaderManager *)this_00,NoMask);
    this->mode = BrushDrawingMode;
  }
  updateMatrix(this);
  local_b8.w._0_4_ = 0xffffffff;
  local_b8.w._4_4_ = 0xffffffff;
  local_b8.h._0_4_ = 0xffffffff;
  local_b8.h._4_4_ = 0xffffffff;
  local_b8.xp._0_4_ = 0xffffffff;
  local_b8.xp._4_4_ = 0xffffffff;
  local_b8.yp._0_4_ = 0xffffffff;
  local_b8.yp._4_4_ = 0xffffffff;
  QTransform::inverted((bool *)&local_88);
  QTransform::mapRect(&local_b8);
  if (iVar5 == 1) {
    __len = (socklen_t)&local_b8;
    QTriangulatingStroker::process(&this->stroker,path,pen);
  }
  else {
    pQVar6 = &local_b8;
    QDashedStrokeProcessor::process(&this->dasher,path,pen,pQVar6);
    local_88.m_cp_rect.x2._0_4_ = 0xffffffff;
    local_88.m_cp_rect.x2._4_4_ = 0xffffffff;
    local_88.m_cp_rect.y2._0_4_ = 0xffffffff;
    local_88.m_cp_rect.y2._4_4_ = 0xffffffff;
    local_88.m_cp_rect.x1._0_4_ = 0xffffffff;
    local_88.m_cp_rect.x1._4_4_ = 0xffffffff;
    local_88.m_cp_rect.y1._0_4_ = 0xffffffff;
    local_88.m_cp_rect.y1._4_4_ = 0xffffffff;
    local_88.m_cache = (CacheEntry *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.m_points = *(qreal **)&this->field_0x4a8;
    local_88.m_count = *(int *)&this->field_0x4b8;
    local_88.m_elements = *(ElementType **)&this->field_0x4c0;
    local_88.m_hints = 7;
    QTriangulatingStroker::process(&this->stroker,&local_88,pen);
    __len = (socklen_t)pQVar6;
    QVectorPath::~QVectorPath(&local_88);
  }
  if ((int)(this->stroker).m_vertices.siz != 0) {
    if (bVar2) {
      iVar5 = 1;
      prepareForDraw(this,true);
      data = (this->stroker).m_vertices.buffer;
      qVar3 = (this->stroker).m_vertices.siz;
      QOpenGLBuffer::bind(&this->vertexBuffer,iVar5,__addr,__len);
      QOpenGLBuffer::allocate(&this->vertexBuffer,data,(int)qVar3 << 2);
      (**(code **)(*(long *)&this->funcs + 0x468))(0,2,0x1406,0,0,0);
      (**(code **)(*(long *)&this->funcs + 0x78))(5,0,(int)(this->stroker).m_vertices.siz / 2);
    }
    else {
      dVar10 = *(double *)(*(long *)pen + 8) * 0.5;
      uVar8 = -(ulong)(dVar10 == 0.0);
      local_f8 = (double)(uVar8 & 0x3fe0000000000000 | ~uVar8 & (ulong)dVar10);
      iVar5 = QPen::joinStyle();
      if (iVar5 == 0) {
        dVar10 = (double)QPen::miterLimit();
        if (local_f8 <= dVar10 * local_f8) {
          local_f8 = dVar10 * local_f8;
        }
      }
      cVar4 = QPen::isCosmetic();
      if (cVar4 != '\0') {
        local_f8 = local_f8 * (double)this->inverseScale;
      }
      QVectorPath::controlPointRect();
      pEVar11 = (ElementType *)
                CONCAT44((float)((double)local_88.m_points - local_f8),
                         (float)((double)local_88.m_elements - local_f8));
      pqVar9 = (qreal *)CONCAT44((float)((double)CONCAT44(local_88.m_cp_rect.x1._4_4_,
                                                          local_88.m_cp_rect.x1._0_4_) + local_f8 +
                                         local_f8 + ((double)local_88.m_points - local_f8)),
                                 (float)((double)CONCAT44(local_88.m_hints,local_88.m_count) +
                                         local_f8 + local_f8 +
                                        ((double)local_88.m_elements - local_f8)));
      local_88.m_elements = pEVar11;
      local_88.m_points = pqVar9;
      fillStencilWithVertexArray
                (this,(this->stroker).m_vertices.buffer,(int)(this->stroker).m_vertices.siz / 2,
                 (int *)0x0,0,(QOpenGLRect *)&local_88,TriStripStrokeFillMode);
      (**(code **)(*(long *)&this->funcs + 0x138))(0x1e00,0x1e01,0x1e01);
      (**(code **)(*(long *)&this->funcs + 0x128))(0x205,0,0x80);
      prepareForDraw(this,false);
      local_88.m_elements = pEVar11;
      local_88.m_points = pqVar9;
      composite(this,(QOpenGLRect *)&local_88);
      (**(code **)(*(long *)&this->funcs + 0x130))(0);
      updateClipScissorTest(this);
    }
  }
  QBrush::~QBrush(local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::stroke(const QVectorPath &path, const QPen &pen)
{
    const QOpenGL2PaintEngineState *s = q->state();
    if (snapToPixelGrid) {
        snapToPixelGrid = false;
        matrixDirty = true;
    }

    const Qt::PenStyle penStyle = qpen_style(pen);
    const QBrush &penBrush = qpen_brush(pen);
    const bool opaque = penBrush.isOpaque() && s->opacity > 0.99;

    transferMode(BrushDrawingMode);

    // updateMatrix() is responsible for setting the inverse scale on
    // the strokers, so we need to call it here and not wait for
    // prepareForDraw() down below.
    updateMatrix();

    QRectF clip = q->state()->matrix.inverted().mapRect(q->state()->clipEnabled
                                                        ? q->state()->rectangleClip
                                                        : QRectF(0, 0, width, height));

    if (penStyle == Qt::SolidLine) {
        stroker.process(path, pen, clip, s->renderHints);

    } else { // Some sort of dash
        dasher.process(path, pen, clip, s->renderHints);

        QVectorPath dashStroke(dasher.points(),
                               dasher.elementCount(),
                               dasher.elementTypes());
        stroker.process(dashStroke, pen, clip, s->renderHints);
    }

    if (!stroker.vertexCount())
        return;

    if (opaque) {
        prepareForDraw(opaque);

        uploadData(QT_VERTEX_COORDS_ATTR, stroker.vertices(), stroker.vertexCount());
        funcs.glDrawArrays(GL_TRIANGLE_STRIP, 0, stroker.vertexCount() / 2);
    } else {
        qreal width = qpen_widthf(pen) / 2;
        if (width == 0)
            width = 0.5;
        qreal extra = pen.joinStyle() == Qt::MiterJoin
                      ? qMax(pen.miterLimit() * width, width)
                      : width;

        if (pen.isCosmetic())
            extra = extra * inverseScale;

        QRectF bounds = path.controlPointRect().adjusted(-extra, -extra, extra, extra);

        fillStencilWithVertexArray(stroker.vertices(), stroker.vertexCount() / 2,
                                      nullptr, 0, bounds, QOpenGL2PaintEngineExPrivate::TriStripStrokeFillMode);

        funcs.glStencilOp(GL_KEEP, GL_REPLACE, GL_REPLACE);

        // Pass when any bit is set, replace stencil value with 0
        funcs.glStencilFunc(GL_NOTEQUAL, 0, GL_STENCIL_HIGH_BIT);
        prepareForDraw(false);

        // Stencil the brush onto the dest buffer
        composite(bounds);

        funcs.glStencilMask(0);

        updateClipScissorTest();
    }
}